

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::ScopedProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,PropertyIdIndexType propertyIdIndex,
          bool forceStrictMode)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  OpCode op_00;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x33);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5ba,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cd570;
    *puVar3 = 0;
  }
  value_00 = ConsumeReg(this,value);
  if ((0x3d < op - 0x4d) || ((0x2400000000000001U >> ((ulong)(op - 0x4d) & 0x3f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5c8,"(false)",
                                "The specified OpCode is not intended for scoped field-access");
    if (!bVar2) goto LAB_007cd570;
    *puVar3 = 0;
  }
  op_00 = op;
  if (forceStrictMode) {
    op_00 = ScopedDeleteFldStrict;
  }
  if ((*(ushort *)
        &(this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0x100
      ) != 0) {
    op_00 = ScopedDeleteFldStrict;
  }
  if (op != ScopedDeleteFld) {
    op_00 = op;
  }
  bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op_00,value_00,propertyIdIndex);
  if (!bVar2) {
    bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op_00,value_00,propertyIdIndex);
    if (!bVar2) {
      bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op_00,value_00,propertyIdIndex);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x5d5,"(success)","success");
        if (!bVar2) {
LAB_007cd570:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::ScopedProperty(OpCode op, RegSlot value, PropertyIdIndexType propertyIdIndex, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementScopedC);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

#if DBG
        switch (op)
        {
        case OpCode::ScopedDeleteFld:
        case OpCode::ScopedEnsureNoRedeclFld:
        case OpCode::ScopedInitFunc:
            break;


        default:
            AssertMsg(false, "The specified OpCode is not intended for scoped field-access");
            break;
        }
#endif

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::ScopedDeleteFld)
            {
                op = OpCode::ScopedDeleteFldStrict;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementScopedC, op, value, propertyIdIndex);
    }